

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::ShouldEmitIntRangeCheck(Instr *this)

{
  bool local_11;
  Instr *this_local;
  
  local_11 = true;
  if ((((this->m_opcode != ToVar) && (local_11 = true, this->m_opcode != LdElemI_A)) &&
      (local_11 = true, this->m_opcode != LdMethodElem)) &&
     ((local_11 = true, this->m_opcode != StElemI_A &&
      (local_11 = true, this->m_opcode != StElemI_A_Strict)))) {
    local_11 = this->m_opcode == StElemC;
  }
  return local_11;
}

Assistant:

bool
Instr::ShouldEmitIntRangeCheck()
{
    // currently only emitting int range check for opnds of instructions with following opcodes:
    return m_opcode == Js::OpCode::ToVar ||
        m_opcode == Js::OpCode::LdElemI_A ||
        m_opcode == Js::OpCode::LdMethodElem ||
        m_opcode == Js::OpCode::StElemI_A ||
        m_opcode == Js::OpCode::StElemI_A_Strict ||
        m_opcode == Js::OpCode::StElemC;
}